

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O3

void __thiscall kwssys::Directory::~Directory(Directory *this)

{
  DirectoryInternals *this_00;
  pointer pcVar1;
  
  this_00 = this->Internal;
  if (this_00 != (DirectoryInternals *)0x0) {
    pcVar1 = (this_00->Path)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this_00->Path).field_2) {
      operator_delete(pcVar1);
    }
    std::
    vector<kwssys::DirectoryInternals::FileData,_std::allocator<kwssys::DirectoryInternals::FileData>_>
    ::~vector(&this_00->Files);
  }
  operator_delete(this_00);
  return;
}

Assistant:

Directory::~Directory()
{
  delete this->Internal;
}